

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

int __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::verify
          (MemoryTestInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  size_type *psVar1;
  ostringstream *this_00;
  TestLog *log;
  long *plVar2;
  undefined8 *puVar3;
  pointer ppCVar4;
  undefined7 extraout_var;
  long *plVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong uVar8;
  bool bVar9;
  ScopedLogSection section;
  VerifyContext verifyContext;
  ulong *local_350;
  long local_348;
  ulong local_340;
  long lStack_338;
  string local_330;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  long *local_2f0 [2];
  long local_2e0 [2];
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0 [2];
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  ScopedLogSection local_290;
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  ResultCollector *local_248;
  undefined1 local_240 [40];
  long local_218;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_210;
  TextureLevel local_1f8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0xb2798e);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_300 = *plVar5;
    lStack_2f8 = plVar2[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *plVar5;
    local_310 = (long *)*plVar2;
  }
  local_308 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_310);
  puVar7 = &local_340;
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_340 = *puVar6;
    lStack_338 = plVar2[3];
    local_350 = puVar7;
  }
  else {
    local_340 = *puVar6;
    local_350 = (ulong *)*plVar2;
  }
  local_348 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  uVar8 = 0xf;
  if (local_350 != puVar7) {
    uVar8 = local_340;
  }
  if (uVar8 < (ulong)(local_2c8 + local_348)) {
    uVar8 = 0xf;
    if (local_2d0 != local_2c0) {
      uVar8 = local_2c0[0];
    }
    if (uVar8 < (ulong)(local_2c8 + local_348)) goto LAB_0067d347;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_0067d347:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_2d0);
  }
  local_240._0_8_ = local_240 + 0x10;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    local_240._16_8_ = *psVar1;
    local_240._24_8_ = puVar3[3];
  }
  else {
    local_240._16_8_ = *psVar1;
    local_240._0_8_ = (size_type *)*puVar3;
  }
  local_240._8_8_ = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0xb2af37);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_258 = *plVar5;
    lStack_250 = plVar2[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar5;
    local_268 = (long *)*plVar2;
  }
  local_260 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_268);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_2a0 = *puVar6;
    lStack_298 = plVar2[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *puVar6;
    local_2b0 = (ulong *)*plVar2;
  }
  local_2a8 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  uVar8 = 0xf;
  if (local_2b0 != &local_2a0) {
    uVar8 = local_2a0;
  }
  if (uVar8 < (ulong)(local_280 + local_2a8)) {
    uVar8 = 0xf;
    if (local_288 != local_278) {
      uVar8 = local_278[0];
    }
    if ((ulong)(local_280 + local_2a8) <= uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2b0);
      goto LAB_0067d5bb;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_288);
LAB_0067d5bb:
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_330.field_2._M_allocated_capacity = *psVar1;
    local_330.field_2._8_8_ = puVar3[3];
  }
  else {
    local_330.field_2._M_allocated_capacity = *psVar1;
    local_330._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_330._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_290,log,(string *)local_240,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0,local_2c0[0] + 1);
  }
  if (local_350 != puVar7) {
    operator_delete(local_350,local_340 + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0],local_2e0[0] + 1);
  }
  local_240._16_8_ =
       (this->m_renderContext).
       super_UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
       .m_data.ptr;
  uVar8 = (this->m_config).size;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  local_240._0_8_ = log;
  local_240._8_8_ = &this->m_resultCollector;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_240 + 0x18),uVar8,
             local_1b0,(allocator_type *)&local_350);
  local_1b0._0_8_ = (TestLog *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_210,((uVar8 >> 6) + 1) - (ulong)((uVar8 & 0x3f) == 0),
             (value_type_conflict3 *)local_1b0,(allocator_type *)&local_350);
  tcu::TextureLevel::TextureLevel(&local_1f8);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Begin verify",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  local_2b0 = (ulong *)0x0;
  ppCVar4 = (this->m_commands).
            super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar9 = (this->m_commands).
          super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppCVar4;
  if (bVar9) {
    local_248 = &this->m_resultCollector;
    do {
      (*ppCVar4[(long)local_2b0]->_vptr_Command[7])(ppCVar4[(long)local_2b0],local_240);
      local_2b0 = (ulong *)((long)local_2b0 + 1);
      ppCVar4 = (this->m_commands).
                super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar9 = local_2b0 <
              (ulong *)((long)(this->m_commands).
                              super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3);
    } while (bVar9);
  }
  if (!bVar9) {
    bVar9 = nextIteration(this);
    puVar7 = (ulong *)(CONCAT71(extraout_var,bVar9) & 0xffffffff);
  }
  tcu::TextureLevel::~TextureLevel(&local_1f8);
  if (local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_210.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((void *)local_240._24_8_ != (void *)0x0) {
    operator_delete((void *)local_240._24_8_,local_218 - local_240._24_8_);
  }
  tcu::TestLog::endSection(local_290.m_log);
  return (uint)puVar7 & 0xffffff01;
}

Assistant:

bool MemoryTestInstance::verify (void)
{
	DE_ASSERT(!m_commands.empty());

	TestLog&					log				= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection	section			(log, "MemoryType" + de::toString(m_memoryTypeNdx) + "Verify" + de::toString(m_iteration),
													  "Memory type " + de::toString(m_memoryTypeNdx) + " verify iteration " + de::toString(m_iteration));
	VerifyContext				verifyContext	(log, m_resultCollector, *m_renderContext, m_config.size);

	log << TestLog::Message << "Begin verify" << TestLog::EndMessage;

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		Command& command = *m_commands[cmdNdx];

		try
		{
			command.verify(verifyContext, cmdNdx);
		}
		catch (const tcu::TestError& e)
		{
			m_resultCollector.fail(de::toString(cmdNdx) + ":" + command.getName() + " failed to verify, got exception: " + string(e.getMessage()));
			return nextIteration();
		}
	}

	return nextIteration();
}